

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QIBusAttribute>::emplace<QIBusAttribute>
          (QMovableArrayOps<QIBusAttribute> *this,qsizetype i,QIBusAttribute *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QIBusAttribute> *in_RSI;
  QArrayDataPointer<QIBusAttribute> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QIBusAttribute tmp;
  QIBusAttribute *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff84;
  byte bVar6;
  GrowthPosition where;
  Inserter local_60;
  undefined1 local_38 [48];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QIBusAttribute>::needsDetach
                    ((QArrayDataPointer<QIBusAttribute> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QIBusAttribute> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QIBusAttribute>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QIBusAttribute>::end
                ((QArrayDataPointer<QIBusAttribute> *)
                 CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      QIBusAttribute::QIBusAttribute
                ((QIBusAttribute *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00133cc8;
    }
    if ((in_RSI == (QArrayDataPointer<QIBusAttribute> *)0x0) &&
       (qVar3 = QArrayDataPointer<QIBusAttribute>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QIBusAttribute>::begin((QArrayDataPointer<QIBusAttribute> *)0x133b9a);
      QIBusAttribute::QIBusAttribute
                ((QIBusAttribute *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_00133cc8;
    }
  }
  memset(local_38,0xaa,0x30);
  QIBusAttribute::QIBusAttribute
            ((QIBusAttribute *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QIBusAttribute> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QIBusAttribute> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QIBusAttribute>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff84,uVar2))),
             (QIBusAttribute **)in_RDI,
             (QArrayDataPointer<QIBusAttribute> *)CONCAT17(uVar5,in_stack_ffffffffffffff70));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff84,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff70),
                       (qsizetype)in_stack_ffffffffffffff68);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68);
    Inserter::~Inserter(&local_60);
  }
  else {
    QArrayDataPointer<QIBusAttribute>::begin((QArrayDataPointer<QIBusAttribute> *)0x133c5c);
    QIBusAttribute::QIBusAttribute
              ((QIBusAttribute *)CONCAT17(uVar5,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
              );
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QIBusAttribute::~QIBusAttribute((QIBusAttribute *)0x133cc8);
LAB_00133cc8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }